

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receiver_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Receiver_PDU::Decode(Receiver_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Receiver_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x24) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Radio_Communications_Header::Decode
            (&this->super_Radio_Communications_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = KDataStream::operator>>
                     (pKStack_18,
                      (unsigned_short *)&(this->super_Radio_Communications_Header).field_0x3a);
  pKVar2 = KDataStream::operator>>
                     (pKVar2,(unsigned_short *)&(this->super_Radio_Communications_Header).field_0x3c
                     );
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32RecPwr);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,(DataTypeBase *)&this->m_TransmitterEntityID);
  KDataStream::operator>>(pKVar2,&this->m_ui16TransmitterRadioID);
  return;
}

Assistant:

void Receiver_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < RECEIVER_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Radio_Communications_Header::Decode( stream, ignoreHeader );

    stream >> m_ui16ReceiverState
           >> m_ui16Padding1
           >> m_f32RecPwr
           >> KDIS_STREAM m_TransmitterEntityID
           >> m_ui16TransmitterRadioID;
}